

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

Constant * __thiscall
LLVMBC::ConstantDataVector::getElementAsConstant(ConstantDataVector *this,uint index)

{
  const_reference ppVVar1;
  Constant *pCVar2;
  uint index_local;
  ConstantDataVector *this_local;
  
  ppVVar1 = std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
            operator[](&this->elements,(ulong)index);
  pCVar2 = cast<LLVMBC::Constant>(*ppVVar1);
  return pCVar2;
}

Assistant:

Constant *ConstantDataVector::getElementAsConstant(unsigned index) const
{
	return cast<Constant>(elements[index]);
}